

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap14_char_map_nondef_binary(FT_Byte *base,FT_UInt32 char_code)

{
  uint uVar1;
  uint uVar2;
  FT_UInt32 uni;
  FT_Byte *p;
  uint local_28;
  FT_UInt32 mid;
  FT_UInt32 min;
  FT_UInt32 max;
  FT_UInt32 numMappings;
  FT_UInt32 char_code_local;
  FT_Byte *base_local;
  
  local_28 = 0;
  uVar1 = (uint)*base << 0x18 | (uint)base[1] << 0x10 | (uint)base[2] << 8 | (uint)base[3];
  while( true ) {
    do {
      mid = uVar1;
      if (mid <= local_28) {
        return 0;
      }
      uVar1 = local_28 + mid >> 1;
      uVar2 = (uint)base[(ulong)(uVar1 * 5) + 4] << 0x10 | (uint)base[(ulong)(uVar1 * 5) + 5] << 8 |
              (uint)base[(ulong)(uVar1 * 5) + 6];
    } while (char_code < uVar2);
    if (char_code <= uVar2) break;
    local_28 = uVar1 + 1;
    uVar1 = mid;
  }
  return (uint)CONCAT11(base[(ulong)(uVar1 * 5) + 7],base[(ulong)(uVar1 * 5) + 8]);
}

Assistant:

static FT_UInt
  tt_cmap14_char_map_nondef_binary( FT_Byte    *base,
                                    FT_UInt32   char_code )
  {
    FT_UInt32  numMappings = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numMappings;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid = ( min + max ) >> 1;
      FT_Byte*   p   = base + 5 * mid;
      FT_UInt32  uni = (FT_UInt32)TT_NEXT_UINT24( p );


      if ( char_code < uni )
        max = mid;
      else if ( char_code > uni )
        min = mid + 1;
      else
        return TT_PEEK_USHORT( p );
    }

    return 0;
  }